

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::UpdateCostData(cmCTestMultiProcessHandler *this)

{
  string *__return_storage_ptr__;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  mapped_type *ppcVar7;
  reference ppVar8;
  reference pbVar9;
  ostream *poVar10;
  double dVar11;
  string *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *i;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  int local_504;
  float local_500;
  int index;
  float cost;
  int prev;
  string name;
  undefined1 local_4d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string line;
  ifstream fin;
  undefined1 local_290 [8];
  PropertiesMap temp;
  ofstream fout;
  undefined1 local_50 [8];
  string tmpout;
  string fname;
  cmCTestMultiProcessHandler *this_local;
  
  __return_storage_ptr__ = (string *)((long)&tmpout.field_2 + 8);
  cmCTest::GetCostDataFile_abi_cxx11_(__return_storage_ptr__,this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 __return_storage_ptr__,".tmp");
  std::ofstream::ofstream
            (&temp.
              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&temp.
                               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_node_count,_Var2);
  PropertiesMap::PropertiesMap((PropertiesMap *)local_290,&this->Properties);
  bVar1 = cmsys::SystemTools::FileExists((string *)((long)&tmpout.field_2 + 8));
  if (bVar1) {
    std::ifstream::ifstream((void *)((long)&line.field_2 + 8));
    _Var2 = std::__cxx11::string::c_str();
    std::ifstream::open(line.field_2._M_local_buf + 8,_Var2);
    std::__cxx11::string::string
              ((string *)
               &parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)((long)&line.field_2 + 8),
                          (string *)
                          &parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&piVar3->_vptr_basic_istream +
                                (long)piVar3->_vptr_basic_istream[-3]));
      if ((!bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&parts.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"---"),
         bVar1)) break;
      cmsys::SystemTools::SplitString
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4d0,
                 (string *)
                 &parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,' ',false);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4d0);
      if (sVar4 < 3) {
        name.field_2._12_4_ = 3;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_4d0,0);
        std::__cxx11::string::string((string *)&cost,(string *)pvVar5);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4d0,1);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        index = atoi(pcVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4d0,2);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        dVar11 = atof(pcVar6);
        local_500 = (float)dVar11;
        local_504 = SearchByName(this,(string *)&cost);
        if (local_504 == -1) {
          poVar10 = std::operator<<((ostream *)
                                    &temp.
                                     super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                     ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    (string *)&cost);
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,index);
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_500);
          std::operator<<(poVar10,"\n");
        }
        else {
          poVar10 = std::operator<<((ostream *)
                                    &temp.
                                     super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                     ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    (string *)&cost);
          poVar10 = std::operator<<(poVar10," ");
          ppcVar7 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&(this->Properties).
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,&local_504);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(*ppcVar7)->PreviousRuns);
          poVar10 = std::operator<<(poVar10," ");
          ppcVar7 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&(this->Properties).
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,&local_504);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(*ppcVar7)->Cost);
          std::operator<<(poVar10,"\n");
          std::
          map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
          ::erase((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                   *)local_290,&local_504);
        }
        std::__cxx11::string::~string((string *)&cost);
        name.field_2._12_4_ = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d0);
    } while (name.field_2._12_4_ == 0);
    std::ifstream::close();
    cmsys::SystemTools::RemoveFile((string *)((long)&tmpout.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  }
  __end1 = std::
           map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ::begin((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    *)local_290);
  i = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
      std::
      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
      ::end((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             *)local_290);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator*(&__end1);
    poVar10 = std::operator<<((ostream *)
                              &temp.
                               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (string *)&ppVar8->second->Name);
    poVar10 = std::operator<<(poVar10," ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,ppVar8->second->PreviousRuns);
    poVar10 = std::operator<<(poVar10," ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,ppVar8->second->Cost);
    std::operator<<(poVar10,"\n");
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)
                  &temp.
                   super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_node_count,"---\n");
  this_00 = this->Failed;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
  f = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&f), bVar1) {
    pbVar9 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    poVar10 = std::operator<<((ostream *)
                              &temp.
                               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)pbVar9);
    std::operator<<(poVar10,"\n");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::ofstream::close();
  cmSystemTools::RenameFile((string *)local_50,(string *)((long)&tmpout.field_2 + 8));
  PropertiesMap::~PropertiesMap((PropertiesMap *)local_290);
  std::ofstream::~ofstream
            (&temp.
              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(tmpout.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmCTestMultiProcessHandler::UpdateCostData()
{
  std::string fname = this->CTest->GetCostDataFile();
  std::string tmpout = fname + ".tmp";
  cmsys::ofstream fout;
  fout.open(tmpout.c_str());

  PropertiesMap temp = this->Properties;

  if (cmSystemTools::FileExists(fname)) {
    cmsys::ifstream fin;
    fin.open(fname.c_str());

    std::string line;
    while (std::getline(fin, line)) {
      if (line == "---") {
        break;
      }
      std::vector<std::string> parts = cmSystemTools::SplitString(line, ' ');
      // Format: <name> <previous_runs> <avg_cost>
      if (parts.size() < 3) {
        break;
      }

      std::string name = parts[0];
      int prev = atoi(parts[1].c_str());
      float cost = static_cast<float>(atof(parts[2].c_str()));

      int index = this->SearchByName(name);
      if (index == -1) {
        // This test is not in memory. We just rewrite the entry
        fout << name << " " << prev << " " << cost << "\n";
      } else {
        // Update with our new average cost
        fout << name << " " << this->Properties[index]->PreviousRuns << " "
             << this->Properties[index]->Cost << "\n";
        temp.erase(index);
      }
    }
    fin.close();
    cmSystemTools::RemoveFile(fname);
  }

  // Add all tests not previously listed in the file
  for (auto const& i : temp) {
    fout << i.second->Name << " " << i.second->PreviousRuns << " "
         << i.second->Cost << "\n";
  }

  // Write list of failed tests
  fout << "---\n";
  for (std::string const& f : *this->Failed) {
    fout << f << "\n";
  }
  fout.close();
  cmSystemTools::RenameFile(tmpout, fname);
}